

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_line_section.hpp
# Opt level: O1

container<pstore::repo::internal_fixup> __thiscall
pstore::repo::debug_line_dispatcher::ifixups(debug_line_dispatcher *this)

{
  debug_line_section *pdVar1;
  container<unsigned_char> cVar2;
  container<pstore::repo::internal_fixup> cVar3;
  
  pdVar1 = this->d_;
  cVar2 = generic_section::payload(&pdVar1->g_);
  cVar3.begin_ = (const_pointer)((ulong)(cVar2.end_ + 7) & 0xfffffffffffffff8);
  cVar3.end_ = cVar3.begin_ + ((pdVar1->g_).field_0.field32_ >> 8);
  return cVar3;
}

Assistant:

container<internal_fixup> ifixups () const final { return d_.ifixups (); }